

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_mechanism.cpp
# Opt level: O3

void __thiscall zmq::null_mechanism_t::zap_msg_available(null_mechanism_t *this)

{
  zap_msg_available((null_mechanism_t *)
                    ((long)&(this->super_zap_client_t)._vptr_zap_client_t +
                    (long)(this->super_zap_client_t)._vptr_zap_client_t[-8]));
  return;
}

Assistant:

int zmq::null_mechanism_t::zap_msg_available ()
{
    if (_zap_reply_received) {
        errno = EFSM;
        return -1;
    }
    const int rc = receive_and_process_zap_reply ();
    if (rc == 0)
        _zap_reply_received = true;
    return rc == -1 ? -1 : 0;
}